

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

bool __thiscall
ser::Serializer::RegisterField
          (Serializer *this,string *name,string *type,int bytesPerElement,int iSize,int jSize,
          int kSize,int lSize,int iMinusHalo,int iPlusHalo,int jMinusHalo,int jPlusHalo,
          int kMinusHalo,int kPlusHalo,int lMinusHalo,int lPlusHalo)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  SerializationException *pSVar4;
  DataFieldInfo *other_00;
  string *__rhs;
  string local_598;
  undefined1 local_578 [8];
  SerializationException exception_1;
  ostringstream errorstr_1;
  SerializationException *anon_var_0;
  DataFieldInfo other;
  string local_300;
  undefined1 local_2e0 [8];
  DataFieldInfo info;
  undefined1 local_230 [4];
  int rank;
  undefined1 local_210 [8];
  SerializationException exception;
  ostringstream local_1d8 [8];
  ostringstream errorstr;
  int jSize_local;
  int iSize_local;
  int bytesPerElement_local;
  string *type_local;
  string *name_local;
  Serializer *this_local;
  
  if ((((0 < iSize) && (0 < jSize)) && (0 < kSize)) && (0 < lSize)) {
    info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         (uint)(iSize != 1) + (uint)(jSize != 1) + (uint)(kSize != 1) + (uint)(lSize != 1);
    DataFieldInfo::DataFieldInfo((DataFieldInfo *)local_2e0);
    std::__cxx11::string::string((string *)&local_300,(string *)name);
    std::__cxx11::string::string
              ((string *)&other.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)type);
    DataFieldInfo::Init((DataFieldInfo *)local_2e0,&local_300,
                        (string *)
                        &other.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        bytesPerElement,
                        info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                        iSize,jSize,kSize,lSize,iMinusHalo,iPlusHalo,jMinusHalo,jPlusHalo,kMinusHalo
                        ,kPlusHalo,lMinusHalo,lPlusHalo);
    std::__cxx11::string::~string
              ((string *)&other.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_300);
    DataFieldInfo::DataFieldInfo((DataFieldInfo *)&anon_var_0);
    other_00 = FieldsTable::Find(&this->fieldsTable_,name);
    DataFieldInfo::operator=((DataFieldInfo *)&anon_var_0,other_00);
    __rhs = DataFieldInfo::type_abi_cxx11_((DataFieldInfo *)&anon_var_0);
    bVar1 = std::operator!=(type,__rhs);
    if (!bVar1) {
      iVar2 = DataFieldInfo::bytesPerElement((DataFieldInfo *)&anon_var_0);
      if (bytesPerElement == iVar2) {
        iVar2 = DataFieldInfo::iSize((DataFieldInfo *)&anon_var_0);
        if (iSize == iVar2) {
          iVar2 = DataFieldInfo::jSize((DataFieldInfo *)&anon_var_0);
          if (jSize == iVar2) {
            iVar2 = DataFieldInfo::kSize((DataFieldInfo *)&anon_var_0);
            if (kSize == iVar2) {
              iVar2 = DataFieldInfo::lSize((DataFieldInfo *)&anon_var_0);
              if (lSize == iVar2) {
                iVar2 = DataFieldInfo::iMinusHaloSize((DataFieldInfo *)&anon_var_0);
                if (iMinusHalo == iVar2) {
                  iVar2 = DataFieldInfo::iPlusHaloSize((DataFieldInfo *)&anon_var_0);
                  if (iPlusHalo == iVar2) {
                    iVar2 = DataFieldInfo::jMinusHaloSize((DataFieldInfo *)&anon_var_0);
                    if (jMinusHalo == iVar2) {
                      iVar2 = DataFieldInfo::jPlusHaloSize((DataFieldInfo *)&anon_var_0);
                      if (jPlusHalo == iVar2) {
                        iVar2 = DataFieldInfo::kMinusHaloSize((DataFieldInfo *)&anon_var_0);
                        if (kMinusHalo == iVar2) {
                          iVar2 = DataFieldInfo::kPlusHaloSize((DataFieldInfo *)&anon_var_0);
                          if (kPlusHalo == iVar2) {
                            iVar2 = DataFieldInfo::lMinusHaloSize((DataFieldInfo *)&anon_var_0);
                            if (lMinusHalo == iVar2) {
                              iVar2 = DataFieldInfo::lPlusHaloSize((DataFieldInfo *)&anon_var_0);
                              if (lPlusHalo == iVar2) {
                                DataFieldInfo::~DataFieldInfo((DataFieldInfo *)&anon_var_0);
                                DataFieldInfo::~DataFieldInfo((DataFieldInfo *)local_2e0);
                                return false;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(exception_1.message_.field_2._M_local_buf + 8));
    poVar3 = std::operator<<((ostream *)(exception_1.message_.field_2._M_local_buf + 8),
                             "Error: field ");
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3," was already registered into ");
    std::operator<<(poVar3,"serializer with different information");
    SerializationException::SerializationException((SerializationException *)local_578);
    std::__cxx11::ostringstream::str();
    SerializationException::Init((SerializationException *)local_578,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,(SerializationException *)local_578);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar3 = std::operator<<((ostream *)local_1d8,"Error: field ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3," is registered with sizes: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iSize);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,jSize);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,kSize);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lSize);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"Sizes must be larger than 0 for all dimensions\n");
  SerializationException::SerializationException((SerializationException *)local_210);
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_210,(string *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,(SerializationException *)local_210);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

bool Serializer::RegisterField(const std::string& name, std::string type, int bytesPerElement,
            int iSize, int jSize, int kSize, int lSize,
            int iMinusHalo, int iPlusHalo, int jMinusHalo, int jPlusHalo,
            int kMinusHalo, int kPlusHalo, int lMinusHalo, int lPlusHalo
        )
{
    // Check that sizes are >= 1
    if (iSize < 1 || jSize < 1 || kSize < 1 || lSize < 1)
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " is registered with sizes: "
            << iSize << "x" << jSize << "x" << kSize << "x" << lSize << "\n"
            << "Sizes must be larger than 0 for all dimensions\n";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Compute rank
    int rank = (iSize != 1 ? 1: 0) + (jSize != 1 ? 1: 0)
             + (kSize != 1 ? 1: 0) + (lSize != 1 ? 1: 0);

    // Create info object
    DataFieldInfo info;
    info.Init(name, type, bytesPerElement, rank,
              iSize, jSize, kSize, lSize,
              iMinusHalo, iPlusHalo, jMinusHalo, jPlusHalo,
              kMinusHalo, kPlusHalo, lMinusHalo, lPlusHalo);

    DataFieldInfo other;
    try
    {
        other = fieldsTable_.Find(name);
    }
    catch (SerializationException&)
    {
        // Field does not exist: register and exit
        fieldsTable_.RegisterField(info);
        return true;
    }

    // Field was alredy registered: check info
    if (   type != other.type()
        || bytesPerElement != other.bytesPerElement()
        || iSize != other.iSize()
        || jSize != other.jSize()
        || kSize != other.kSize()
        || lSize != other.lSize()
        || iMinusHalo != other.iMinusHaloSize()
        || iPlusHalo  != other.iPlusHaloSize()
        || jMinusHalo != other.jMinusHaloSize()
        || jPlusHalo  != other.jPlusHaloSize()
        || kMinusHalo != other.kMinusHaloSize()
        || kPlusHalo  != other.kPlusHaloSize()
        || lMinusHalo != other.lMinusHaloSize()
        || lPlusHalo  != other.lPlusHaloSize()
       )
    {
        std::ostringstream errorstr;
        errorstr << "Error: field " << name << " was already registered into "
            << "serializer with different information";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    return false;
}